

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::Base::~Base(Base *this)

{
  void *in_RDI;
  
  ~Base((Base *)0x119448);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~Base() {}